

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__do_zlib(stbi__zbuf *a,char *obuf,int olen,int exp,int parse_header)

{
  stbi__zhuffman *z;
  uint uVar1;
  byte *pbVar2;
  stbi_uc *psVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  ushort uVar9;
  uint uVar10;
  int iVar11;
  stbi_uc *psVar12;
  int iVar13;
  stbi_uc sVar14;
  uint uVar15;
  byte *pbVar16;
  byte *pbVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  stbi__uint32 sVar21;
  stbi__uint32 sVar22;
  uint uVar23;
  char *pcVar24;
  ulong uVar25;
  long in_FS_OFFSET;
  stbi_uc lencodes [455];
  stbi__zhuffman z_codelength;
  undefined8 local_a08;
  undefined7 uStack_a00;
  undefined4 uStack_9f9;
  byte bStack_9e9;
  stbi_uc local_9e8 [468];
  stbi__zhuffman local_814;
  
  a->zout_start = obuf;
  a->zout = obuf;
  a->zout_end = obuf + olen;
  a->z_expandable = exp;
  if (parse_header != 0) {
    pbVar16 = a->zbuffer;
    pbVar2 = a->zbuffer_end;
    uVar9 = 0;
    if (pbVar16 < pbVar2) {
      a->zbuffer = pbVar16 + 1;
      bVar4 = *pbVar16;
      pbVar16 = pbVar16 + 1;
    }
    else {
      bVar4 = 0;
    }
    pbVar17 = pbVar16;
    if (pbVar16 < pbVar2) {
      pbVar17 = pbVar16 + 1;
      a->zbuffer = pbVar17;
      uVar9 = (ushort)*pbVar16;
    }
    if ((((pbVar2 <= pbVar17) || (0x842 < (ushort)(((ushort)bVar4 << 8 | uVar9) * 0x7bdf))) ||
        ((uVar9 & 0x20) != 0)) || ((bVar4 & 0xf) != 8)) {
LAB_001572eb:
      *(char **)(in_FS_OFFSET + -0x20) = "Corrupt PNG";
LAB_001572fd:
      return 0;
    }
  }
  a->num_bits = 0;
  a->code_buffer = 0;
  z = &a->z_distance;
  iVar11 = 0;
  do {
    if (iVar11 < 1) {
      stbi__fill_bits(a);
      iVar11 = a->num_bits;
    }
    uVar1 = a->code_buffer;
    sVar21 = uVar1 >> 1;
    a->code_buffer = sVar21;
    iVar6 = iVar11 + -1;
    a->num_bits = iVar6;
    if (iVar11 < 3) {
      stbi__fill_bits(a);
      iVar6 = a->num_bits;
      sVar21 = a->code_buffer;
    }
    sVar22 = sVar21 >> 2;
    a->code_buffer = sVar22;
    uVar5 = iVar6 - 2;
    a->num_bits = uVar5;
    switch(sVar21 & 3) {
    case 0:
      uVar15 = uVar5 & 7;
      if (uVar15 != 0) {
        if (iVar6 < 2) {
          stbi__fill_bits(a);
          uVar5 = a->num_bits;
          sVar22 = a->code_buffer;
        }
        sVar22 = sVar22 >> (sbyte)uVar15;
        a->code_buffer = sVar22;
        uVar5 = uVar5 - uVar15;
        a->num_bits = uVar5;
      }
      if ((int)uVar5 < 1) {
        if ((int)uVar5 < 0) goto LAB_001572eb;
        uVar25 = 0;
LAB_00157249:
        psVar12 = a->zbuffer;
        psVar3 = a->zbuffer_end;
        do {
          if (psVar12 < psVar3) {
            a->zbuffer = psVar12 + 1;
            sVar14 = *psVar12;
            psVar12 = psVar12 + 1;
          }
          else {
            sVar14 = '\0';
          }
          *(stbi_uc *)((long)local_814.fast + uVar25) = sVar14;
          uVar25 = uVar25 + 1;
        } while (uVar25 != 4);
      }
      else {
        uVar15 = uVar5 - 1 >> 3;
        uVar25 = (ulong)(uVar15 + 1);
        uVar18 = 0xffffffffffffffff;
        do {
          *(char *)((long)local_814.fast + uVar18 + 1) = (char)sVar22;
          sVar22 = sVar22 >> 8;
          uVar18 = uVar18 + 1;
        } while (uVar15 != uVar18);
        iVar11 = uVar5 - (uVar5 - 1 & 0xfffffff8);
        a->code_buffer = sVar22;
        a->num_bits = iVar11 + -8;
        if (iVar11 != 8) goto LAB_001572eb;
        if (uVar18 < 3) goto LAB_00157249;
      }
      if ((local_814.fast[1] ^ local_814.fast[0]) == 0xffff) {
        psVar12 = a->zbuffer;
        uVar25 = (ulong)local_814.fast[0];
        if (psVar12 + uVar25 <= a->zbuffer_end) {
          pcVar24 = a->zout;
          if (a->zout_end < pcVar24 + uVar25) {
            iVar11 = stbi__zexpand(a,pcVar24,(uint)local_814.fast[0]);
            if (iVar11 == 0) {
              return 0;
            }
            psVar12 = a->zbuffer;
            pcVar24 = a->zout;
          }
          memcpy(pcVar24,psVar12,uVar25);
          a->zbuffer = a->zbuffer + uVar25;
          a->zout = a->zout + uVar25;
          goto LAB_001572d6;
        }
      }
      goto LAB_001572eb;
    case 1:
      iVar11 = stbi__zbuild_huffman
                         (&a->z_length,
                          "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\b\b\b\b\b\b\b\b"
                          ,0x120);
      if (iVar11 == 0) {
        return 0;
      }
      iVar11 = stbi__zbuild_huffman
                         (z,
                          "\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05"
                          ,0x20);
      break;
    case 2:
      if (iVar6 < 7) {
        stbi__fill_bits(a);
        uVar5 = a->num_bits;
        sVar22 = a->code_buffer;
      }
      uVar15 = sVar22 >> 5;
      a->code_buffer = uVar15;
      iVar11 = uVar5 - 5;
      a->num_bits = iVar11;
      if ((int)uVar5 < 10) {
        stbi__fill_bits(a);
        iVar11 = a->num_bits;
        uVar15 = a->code_buffer;
      }
      uVar5 = uVar15 >> 5;
      a->code_buffer = uVar5;
      iVar6 = iVar11 + -5;
      a->num_bits = iVar6;
      if (iVar11 < 9) {
        stbi__fill_bits(a);
        iVar6 = a->num_bits;
        uVar5 = a->code_buffer;
      }
      uVar23 = (sVar22 & 0x1f) + 0x101;
      iVar11 = (uVar15 & 0x1f) + 1;
      uVar15 = uVar5 >> 4;
      a->code_buffer = uVar15;
      iVar6 = iVar6 + -4;
      a->num_bits = iVar6;
      local_a08 = 0;
      uStack_a00 = 0;
      uStack_9f9 = 0;
      uVar25 = 0;
      do {
        uVar10 = uVar15;
        if (iVar6 < 3) {
          stbi__fill_bits(a);
          iVar6 = a->num_bits;
          uVar10 = a->code_buffer;
        }
        uVar15 = uVar10 >> 3;
        a->code_buffer = uVar15;
        iVar6 = iVar6 + -3;
        a->num_bits = iVar6;
        *(byte *)((long)&local_a08 +
                 (ulong)(byte)(&stbi__compute_huffman_codes(stbi__zbuf*)::length_dezigzag)[uVar25])
             = (byte)uVar10 & 7;
        uVar25 = uVar25 + 1;
      } while ((uVar5 & 0xf) + 4 != uVar25);
      iVar6 = stbi__zbuild_huffman(&local_814,(stbi_uc *)&local_a08,0x13);
      if (iVar6 == 0) {
        return 0;
      }
      iVar7 = iVar11 + uVar23;
      iVar6 = a->num_bits;
      iVar13 = 0;
      do {
        if (iVar6 < 0x10) {
          if (a->zbuffer_end <= a->zbuffer) goto LAB_001572eb;
          stbi__fill_bits(a);
        }
        uVar5 = a->code_buffer;
        uVar9 = local_814.fast[uVar5 & 0x1ff];
        if (uVar9 == 0) {
          uVar9 = (ushort)uVar5 << 8 | (ushort)uVar5 >> 8;
          uVar15 = (uVar9 & 0xf0f) << 4 | (uVar9 & 0xf0f0) >> 4;
          uVar15 = (uVar15 >> 2 & 0x3333) + (uVar15 & 0x3333) * 4;
          uVar15 = (uVar15 >> 1 & 0x5555) + (uVar15 & 0x5555) * 2;
          lVar8 = 0;
          do {
            lVar19 = lVar8;
            lVar8 = lVar19 + 1;
          } while (local_814.maxcode[lVar19 + 10] <= (int)uVar15);
          if (((0xf < lVar19 + 10U) ||
              (lVar20 = (ulong)local_814.firstsymbol[lVar19 + 10] +
                        ((ulong)(uVar15 >> (7U - (char)lVar8 & 0x1f)) -
                        (ulong)local_814.firstcode[lVar19 + 10]), 0x11f < (int)lVar20)) ||
             ((ulong)*(byte *)((long)&local_814 + lVar20 + 0x484) - 9 != lVar8)) goto LAB_001572eb;
          uVar5 = uVar5 >> ((byte)(lVar19 + 10U) & 0x1f);
          a->code_buffer = uVar5;
          iVar6 = (a->num_bits - (int)lVar8) + -9;
          a->num_bits = iVar6;
          uVar9 = *(ushort *)((long)&local_814 + lVar20 * 2 + 0x5a4);
        }
        else {
          uVar5 = uVar5 >> ((byte)(uVar9 >> 9) & 0x1f);
          a->code_buffer = uVar5;
          iVar6 = a->num_bits - (uint)(uVar9 >> 9);
          a->num_bits = iVar6;
          uVar9 = uVar9 & 0x1ff;
        }
        if (0x12 < uVar9) goto LAB_001572eb;
        if (uVar9 < 0x10) {
          local_9e8[iVar13] = (char)uVar9;
          iVar13 = iVar13 + 1;
        }
        else {
          if (uVar9 == 0x11) {
            if (iVar6 < 3) {
              stbi__fill_bits(a);
              iVar6 = a->num_bits;
              uVar5 = a->code_buffer;
            }
            a->code_buffer = uVar5 >> 3;
            iVar6 = iVar6 + -3;
            a->num_bits = iVar6;
            uVar5 = (uVar5 & 7) + 3;
LAB_001571bd:
            bVar4 = 0;
          }
          else {
            if (uVar9 != 0x10) {
              if (iVar6 < 7) {
                stbi__fill_bits(a);
                iVar6 = a->num_bits;
                uVar5 = a->code_buffer;
              }
              a->code_buffer = uVar5 >> 7;
              iVar6 = iVar6 + -7;
              a->num_bits = iVar6;
              uVar5 = (uVar5 & 0x7f) + 0xb;
              goto LAB_001571bd;
            }
            if (iVar6 < 2) {
              stbi__fill_bits(a);
              iVar6 = a->num_bits;
              uVar5 = a->code_buffer;
            }
            a->code_buffer = uVar5 >> 2;
            iVar6 = iVar6 + -2;
            a->num_bits = iVar6;
            if (iVar13 == 0) goto LAB_001572eb;
            uVar5 = (uVar5 & 3) + 3;
            bVar4 = (&bStack_9e9)[iVar13];
          }
          if (iVar7 - iVar13 < (int)uVar5) goto LAB_001572eb;
          memset(local_9e8 + iVar13,(uint)bVar4,(ulong)uVar5);
          iVar13 = iVar13 + uVar5;
        }
      } while (iVar13 < iVar7);
      if (iVar13 != iVar7) goto LAB_001572eb;
      iVar6 = stbi__zbuild_huffman(&a->z_length,local_9e8,uVar23);
      if (iVar6 == 0) {
        return 0;
      }
      iVar11 = stbi__zbuild_huffman(z,local_9e8 + uVar23,iVar11);
      break;
    case 3:
      goto LAB_001572fd;
    }
    if (iVar11 == 0) {
      return 0;
    }
    pcVar24 = a->zout;
    while( true ) {
      while( true ) {
        if (a->num_bits < 0x10) {
          if (a->zbuffer_end <= a->zbuffer) goto LAB_001572eb;
          stbi__fill_bits(a);
        }
        uVar5 = a->code_buffer;
        uVar9 = (a->z_length).fast[uVar5 & 0x1ff];
        if (uVar9 == 0) {
          uVar9 = (ushort)uVar5 << 8 | (ushort)uVar5 >> 8;
          uVar15 = (uVar9 & 0xf0f) << 4 | (uVar9 & 0xf0f0) >> 4;
          uVar15 = (uVar15 >> 2 & 0x3333) + (uVar15 & 0x3333) * 4;
          uVar15 = (uVar15 >> 1 & 0x5555) + (uVar15 & 0x5555) * 2;
          lVar8 = 0;
          do {
            lVar19 = lVar8;
            lVar8 = lVar19 + 1;
          } while ((a->z_length).maxcode[lVar19 + 10] <= (int)uVar15);
          if (((0xf < lVar19 + 10U) ||
              (lVar20 = (ulong)(a->z_length).firstsymbol[lVar19 + 10] +
                        ((ulong)(uVar15 >> (7U - (char)lVar8 & 0x1f)) -
                        (ulong)(a->z_length).firstcode[lVar19 + 10]), 0x11f < (int)lVar20)) ||
             ((ulong)*(byte *)((long)a + lVar20 + 0x4b8) - 9 != lVar8)) goto LAB_001572eb;
          uVar5 = uVar5 >> ((byte)(lVar19 + 10U) & 0x1f);
          a->code_buffer = uVar5;
          iVar11 = (a->num_bits - (int)lVar8) + -9;
          a->num_bits = iVar11;
          uVar15 = (uint)*(ushort *)((long)a + lVar20 * 2 + 0x5d8);
        }
        else {
          uVar5 = uVar5 >> ((byte)(uVar9 >> 9) & 0x1f);
          a->code_buffer = uVar5;
          iVar11 = a->num_bits - (uint)(uVar9 >> 9);
          a->num_bits = iVar11;
          uVar15 = uVar9 & 0x1ff;
        }
        if (0xff < uVar15) break;
        if (a->zout_end <= pcVar24) {
          iVar11 = stbi__zexpand(a,pcVar24,1);
          if (iVar11 == 0) {
            return 0;
          }
          pcVar24 = a->zout;
        }
        *pcVar24 = (char)uVar15;
        pcVar24 = pcVar24 + 1;
      }
      if (uVar15 == 0x100) break;
      if (0x11d < uVar15) goto LAB_001572eb;
      uVar25 = (ulong)(uVar15 - 0x101);
      uVar15 = stbi__zlength_base[uVar25];
      if (0xffffffffffffffeb < uVar25 - 0x1c) {
        iVar6 = stbi__zlength_extra[uVar25];
        if (iVar11 < iVar6) {
          stbi__fill_bits(a);
          iVar11 = a->num_bits;
          uVar5 = a->code_buffer;
        }
        uVar23 = ~(-1 << ((byte)iVar6 & 0x1f)) & uVar5;
        uVar5 = uVar5 >> ((byte)iVar6 & 0x1f);
        a->code_buffer = uVar5;
        iVar11 = iVar11 - iVar6;
        a->num_bits = iVar11;
        uVar15 = uVar15 + uVar23;
      }
      if (iVar11 < 0x10) {
        if (a->zbuffer_end <= a->zbuffer) goto LAB_001572eb;
        stbi__fill_bits(a);
        uVar5 = a->code_buffer;
      }
      uVar9 = z->fast[uVar5 & 0x1ff];
      if (uVar9 == 0) {
        uVar9 = (ushort)uVar5 << 8 | (ushort)uVar5 >> 8;
        uVar23 = (uVar9 & 0xf0f) << 4 | (uVar9 & 0xf0f0) >> 4;
        uVar23 = (uVar23 >> 2 & 0x3333) + (uVar23 & 0x3333) * 4;
        uVar23 = (uVar23 >> 1 & 0x5555) + (uVar23 & 0x5555) * 2;
        lVar8 = 0;
        do {
          lVar19 = lVar8;
          lVar8 = lVar19 + 1;
        } while ((a->z_distance).maxcode[lVar19 + 10] <= (int)uVar23);
        if (((0xf < lVar19 + 10U) ||
            (lVar20 = (ulong)(a->z_distance).firstsymbol[lVar19 + 10] +
                      ((ulong)(uVar23 >> (7U - (char)lVar8 & 0x1f)) -
                      (ulong)(a->z_distance).firstcode[lVar19 + 10]), 0x11f < (int)lVar20)) ||
           ((ulong)*(byte *)((long)a + lVar20 + 0xc9c) - 9 != lVar8)) goto LAB_001572eb;
        uVar5 = uVar5 >> ((byte)(lVar19 + 10U) & 0x1f);
        a->code_buffer = uVar5;
        iVar11 = (a->num_bits - (int)lVar8) + -9;
        a->num_bits = iVar11;
        uVar23 = (uint)*(ushort *)((long)a + lVar20 * 2 + 0xdbc);
      }
      else {
        uVar5 = uVar5 >> ((byte)(uVar9 >> 9) & 0x1f);
        a->code_buffer = uVar5;
        iVar11 = a->num_bits - (uint)(uVar9 >> 9);
        a->num_bits = iVar11;
        uVar23 = uVar9 & 0x1ff;
      }
      if (0x1d < uVar23) goto LAB_001572eb;
      iVar6 = stbi__zdist_base[uVar23];
      if (3 < uVar23) {
        iVar13 = stbi__zdist_extra[uVar23];
        if (iVar11 < iVar13) {
          stbi__fill_bits(a);
          iVar11 = a->num_bits;
          uVar5 = a->code_buffer;
        }
        a->code_buffer = uVar5 >> ((byte)iVar13 & 0x1f);
        a->num_bits = iVar11 - iVar13;
        iVar6 = iVar6 + (~(-1 << ((byte)iVar13 & 0x1f)) & uVar5);
      }
      if ((long)pcVar24 - (long)a->zout_start < (long)iVar6) goto LAB_001572eb;
      if (a->zout_end < pcVar24 + (int)uVar15) {
        iVar11 = stbi__zexpand(a,pcVar24,uVar15);
        if (iVar11 == 0) {
          return 0;
        }
        pcVar24 = a->zout;
      }
      lVar8 = -(long)iVar6;
      if (iVar6 == 1) {
        if (uVar15 != 0) {
          memset(pcVar24,(uint)(byte)pcVar24[lVar8],(ulong)uVar15);
          pcVar24 = pcVar24 + (ulong)(uVar15 - 1) + 1;
        }
      }
      else {
        for (; uVar15 != 0; uVar15 = uVar15 - 1) {
          *pcVar24 = pcVar24[lVar8];
          pcVar24 = pcVar24 + 1;
        }
      }
    }
    a->zout = pcVar24;
LAB_001572d6:
    if ((uVar1 & 1) != 0) {
      return 1;
    }
    iVar11 = a->num_bits;
  } while( true );
}

Assistant:

static int stbi__do_zlib(stbi__zbuf *a, char *obuf, int olen, int exp, int parse_header)
{
   a->zout_start = obuf;
   a->zout       = obuf;
   a->zout_end   = obuf + olen;
   a->z_expandable = exp;

   return stbi__parse_zlib(a, parse_header);
}